

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * __thiscall QByteArray::replace(QByteArray *this,char before,char after)

{
  size_t __n;
  char *__s;
  Data *pDVar1;
  QArrayData *data;
  char *pcVar2;
  void *pvVar3;
  long lVar4;
  Initialization extraout_EDX;
  char cVar5;
  ptrdiff_t _Num;
  size_t __n_00;
  long lVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((before != after) && (__n = (this->d).size, __n != 0)) {
    __s = (this->d).ptr;
    pvVar3 = memchr(__s,(int)before,__n);
    __n_00 = (long)pvVar3 - (long)__s;
    if (-1 < (long)__n_00 && pvVar3 != (void *)0x0) {
      pDVar1 = (this->d).d;
      if ((pDVar1 == (Data *)0x0) ||
         (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray(&local_58,__n,extraout_EDX);
        pcVar2 = local_58.d.ptr;
        if ((long)pvVar3 - (long)__s != 0) {
          memmove(local_58.d.ptr,(this->d).ptr,__n_00);
        }
        pcVar2[__n_00] = after;
        pcVar7 = (this->d).ptr;
        lVar4 = (this->d).size;
        if (pcVar7 + __n_00 + 1 != pcVar7 + lVar4) {
          lVar6 = ((long)pvVar3 - (long)__s) + 1;
          do {
            cVar5 = pcVar7[lVar6];
            if (pcVar7[lVar6] == before) {
              cVar5 = after;
            }
            pcVar2[lVar6] = cVar5;
            lVar6 = lVar6 + 1;
          } while (lVar4 != lVar6);
          pcVar7 = (this->d).ptr;
          lVar4 = (this->d).size;
        }
        data = &((this->d).d)->super_QArrayData;
        (this->d).d = local_58.d.d;
        (this->d).ptr = local_58.d.ptr;
        (this->d).size = local_58.d.size;
        local_58.d.d = (Data *)data;
        local_58.d.ptr = pcVar7;
        local_58.d.size = lVar4;
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data,1,0x10);
          }
        }
      }
      else {
        __s[__n_00] = after;
        pcVar2 = (this->d).ptr;
        lVar4 = (this->d).size;
        if (pcVar2 + __n_00 + 1 != pcVar2 + lVar4) {
          pcVar7 = (char *)((long)pvVar3 + 1);
          do {
            if (pcVar7[(long)pcVar2 - (long)__s] == before) {
              pcVar7[(long)pcVar2 - (long)__s] = after;
            }
            pcVar7 = pcVar7 + 1;
          } while (__s + lVar4 != pcVar7);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::replace(char before, char after)
{
    if (before != after) {
        if (const auto pos = indexOf(before); pos >= 0) {
            if (d.needsDetach()) {
                QByteArray tmp(size(), Qt::Uninitialized);
                auto dst = tmp.d.data();
                dst = std::copy(d.data(), d.data() + pos, dst);
                *dst++ = after;
                std::replace_copy(d.data() + pos + 1, d.end(), dst, before, after);
                swap(tmp);
            } else {
                // in-place
                d.data()[pos] = after;
                std::replace(d.data() + pos + 1, d.end(), before, after);
            }
        }
    }
    return *this;
}